

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O3

void __thiscall QPlainTextEditSearchWidget::doReplaceAll(QPlainTextEditSearchWidget *this)

{
  char cVar1;
  bool bVar2;
  
  cVar1 = QPlainTextEdit::isReadOnly();
  if (cVar1 == '\0') {
    QPlainTextEdit::moveCursor((MoveOperation)*(undefined8 *)(this + 0x88),KeepAnchor);
    do {
      bVar2 = doSearch(this,true,false,true);
      if (!bVar2) {
        return;
      }
      bVar2 = doReplace(this,true);
    } while (bVar2);
  }
  return;
}

Assistant:

void QPlainTextEditSearchWidget::doReplaceAll() {
    if (_textEdit->isReadOnly()) {
        return;
    }

    // start at the top
    _textEdit->moveCursor(QTextCursor::Start);

    // replace until everything to the bottom is replaced
    while (doSearch(true, false) && doReplace(true)) {
    }
}